

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O2

int secp256k1_musig_nonce_gen_counter
              (secp256k1_context *ctx,secp256k1_musig_secnonce *secnonce,
              secp256k1_musig_pubnonce *pubnonce,uint64_t nonrepeating_cnt,
              secp256k1_keypair *keypair,uchar *msg32,secp256k1_musig_keyagg_cache *keyagg_cache,
              uchar *extra_input32)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  uchar buf [32];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  secp256k1_pubkey local_78;
  
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  buf[0x18] = '\0';
  buf[0x19] = '\0';
  buf[0x1a] = '\0';
  buf[0x1b] = '\0';
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  buf[0x1e] = '\0';
  buf[0x1f] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  if (ctx == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/musig/session_impl.h"
            ,0x1f7,"test condition failed: ctx != NULL");
    abort();
  }
  if (secnonce == (secp256k1_musig_secnonce *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "secnonce != NULL";
  }
  else {
    memset(secnonce,0,0x84);
    if (keypair != (secp256k1_keypair *)0x0) {
      buf._0_8_ = nonrepeating_cnt >> 0x38 | (nonrepeating_cnt & 0xff000000000000) >> 0x28 |
                  (nonrepeating_cnt & 0xff0000000000) >> 0x18 |
                  (nonrepeating_cnt & 0xff00000000) >> 8 | (nonrepeating_cnt & 0xff000000) << 8 |
                  (nonrepeating_cnt & 0xff0000) << 0x18 | (nonrepeating_cnt & 0xff00) << 0x28 |
                  nonrepeating_cnt << 0x38;
      local_98 = *(undefined8 *)keypair->data;
      uStack_90 = *(undefined8 *)(keypair->data + 8);
      local_88 = *(undefined8 *)(keypair->data + 0x10);
      uStack_80 = *(undefined8 *)(keypair->data + 0x18);
      local_78.data._0_8_ = *(undefined8 *)(keypair->data + 0x20);
      local_78.data._8_8_ = *(undefined8 *)(keypair->data + 0x28);
      local_78.data._16_8_ = *(undefined8 *)(keypair->data + 0x30);
      local_78.data._24_8_ = *(undefined8 *)(keypair->data + 0x38);
      local_78.data._32_8_ = *(undefined8 *)(keypair->data + 0x40);
      local_78.data._40_8_ = *(undefined8 *)(keypair->data + 0x48);
      local_78.data._48_8_ = *(undefined8 *)(keypair->data + 0x50);
      local_78.data._56_8_ = *(undefined8 *)(keypair->data + 0x58);
      iVar1 = secp256k1_musig_nonce_gen_internal
                        (ctx,secnonce,pubnonce,buf,(uchar *)&local_98,&local_78,msg32,keyagg_cache,
                         extra_input32);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_memclear(&local_98,0x20);
      return 1;
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "keypair != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_musig_nonce_gen_counter(const secp256k1_context* ctx, secp256k1_musig_secnonce *secnonce, secp256k1_musig_pubnonce *pubnonce, uint64_t nonrepeating_cnt, const secp256k1_keypair *keypair, const unsigned char *msg32, const secp256k1_musig_keyagg_cache *keyagg_cache, const unsigned char *extra_input32) {
    unsigned char buf[32] = { 0 };
    unsigned char seckey[32];
    secp256k1_pubkey pubkey;
    int ret;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secnonce != NULL);
    memset(secnonce, 0, sizeof(*secnonce));
    ARG_CHECK(keypair != NULL);

    secp256k1_write_be64(buf, nonrepeating_cnt);
    /* keypair_sec and keypair_pub do not fail if the arguments are not NULL */
    ret = secp256k1_keypair_sec(ctx, seckey, keypair);
    VERIFY_CHECK(ret);
    ret = secp256k1_keypair_pub(ctx, &pubkey, keypair);
    VERIFY_CHECK(ret);
#ifndef VERIFY
    (void) ret;
#endif

    if (!secp256k1_musig_nonce_gen_internal(ctx, secnonce, pubnonce, buf, seckey, &pubkey, msg32, keyagg_cache, extra_input32)) {
        return 0;
    }
    secp256k1_memclear(seckey, sizeof(seckey));
    return 1;
}